

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

ostream * operator<<(ostream *out,Image *image)

{
  string local_30;
  
  Image::toString_abi_cxx11_(&local_30,image);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, Image& image)
{
    out << image.toString();

    return out;
}